

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

void fill_insn(cs_struct *handle,cs_insn *insn,char *buffer,MCInst *mci,PostPrinter_t postprinter,
              uint8_t *code)

{
  uint uVar1;
  bool bVar2;
  size_t local_58;
  char *pcStack_48;
  uint copy_size;
  char *mnem;
  char *sp;
  uint8_t *code_local;
  PostPrinter_t postprinter_local;
  MCInst *mci_local;
  char *buffer_local;
  cs_insn *insn_local;
  cs_struct *handle_local;
  
  if (insn->size < 0x11) {
    local_58 = (size_t)insn->size;
  }
  else {
    local_58 = 0x10;
  }
  memcpy(insn->bytes,code + ((long)(int)(uint)insn->size - local_58),local_58);
  insn->size = (uint16_t)local_58;
  uVar1 = MCInst_getOpcodePub(mci);
  if (uVar1 != 0) {
    uVar1 = MCInst_getOpcodePub(mci);
    insn->id = uVar1;
  }
  if (postprinter != (PostPrinter_t)0x0) {
    (*postprinter)((csh)handle,insn,buffer,mci);
  }
  pcStack_48 = insn->mnemonic;
  for (mnem = buffer; ((*mnem != '\0' && (*mnem != ' ')) && (*mnem != '\t')); mnem = mnem + 1) {
    if (*mnem == '|') {
      *mnem = ' ';
    }
    *pcStack_48 = *mnem;
    pcStack_48 = pcStack_48 + 1;
  }
  *pcStack_48 = '\0';
  if (*mnem == '\0') {
    insn->op_str[0] = '\0';
  }
  else {
    do {
      mnem = mnem + 1;
      bVar2 = true;
      if (*mnem != ' ') {
        bVar2 = *mnem == '\t';
      }
    } while (bVar2);
    strncpy(insn->op_str,mnem,0x9f);
    insn->op_str[0x9f] = '\0';
  }
  return;
}

Assistant:

static void fill_insn(struct cs_struct *handle, cs_insn *insn, char *buffer, MCInst *mci,
		PostPrinter_t postprinter, const uint8_t *code)
{
#ifndef CAPSTONE_DIET
	char *sp, *mnem;
#endif
	unsigned int copy_size = MIN(sizeof(insn->bytes), insn->size);

	// fill the instruction bytes.
	// we might skip some redundant bytes in front in the case of X86
	memcpy(insn->bytes, code + insn->size - copy_size, copy_size);
	insn->size = copy_size;

	// alias instruction might have ID saved in OpcodePub
	if (MCInst_getOpcodePub(mci))
		insn->id = MCInst_getOpcodePub(mci);

	// post printer handles some corner cases (hacky)
	if (postprinter)
		postprinter((csh)handle, insn, buffer, mci);

#ifndef CAPSTONE_DIET
	// fill in mnemonic & operands
	// find first space or tab
	sp = buffer;
	mnem = insn->mnemonic;
	for (sp = buffer; *sp; sp++) {
		if (*sp == ' '|| *sp == '\t')
			break;
		if (*sp == '|')	// lock|rep prefix for x86
			*sp = ' ';
		// copy to @mnemonic
		*mnem = *sp;
		mnem++;
	}

	*mnem = '\0';

	// copy @op_str
	if (*sp) {
		// find the next non-space char
		sp++;
		for (; ((*sp == ' ') || (*sp == '\t')); sp++);
		strncpy(insn->op_str, sp, sizeof(insn->op_str) - 1);
		insn->op_str[sizeof(insn->op_str) - 1] = '\0';
	} else
		insn->op_str[0] = '\0';
#endif
}